

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
::~Stack(Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
         *this)

{
  long in_RDI;
  NodeAlgorithm *p;
  long local_10;
  
  for (local_10 = *(long *)(in_RDI + 0x10); local_10 != *(long *)(in_RDI + 8);
      local_10 = local_10 + -4) {
  }
  if (*(long *)(in_RDI + 8) != 0) {
    Lib::free(*(void **)(in_RDI + 8));
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }